

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PWM.cpp
# Opt level: O0

void __thiscall GPIO::PWM::Impl::Impl(Impl *this,string *channel,int frequency_hz)

{
  Directions DVar1;
  runtime_error *this_00;
  MainModule *pMVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  int in_EDX;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  exception *e;
  Directions sysfs_cfg;
  Directions app_cfg;
  ChannelInfo *in_stack_00000278;
  MainModule *in_stack_00000280;
  ChannelInfo *in_stack_000002a0;
  MainModule *in_stack_000002a8;
  ChannelInfo *in_stack_ffffffffffffff10;
  MainModule *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  MainModule *in_stack_ffffffffffffff28;
  undefined1 start;
  ostream *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int frequency_hz_00;
  undefined4 in_stack_ffffffffffffff40;
  Directions in_stack_ffffffffffffff44;
  MainModule *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Directions in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff74;
  ChannelInfo *in_stack_ffffffffffffff78;
  MainModule *in_stack_ffffffffffffff80;
  
  frequency_hz_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  global();
  MainModule::_channel_to_info
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x30,0));
  start = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  *(undefined1 *)(in_RDI + 0xc0) = 0;
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined4 *)(in_RDI + 0xd8) = 0;
  global();
  DVar1 = MainModule::_app_channel_configuration
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (DVar1 != HARD_PWM) {
    if ((DVar1 == IN) || (DVar1 == OUT)) {
      cleanup(in_RSI);
    }
    pMVar2 = global();
    if ((pMVar2->_gpio_warnings & 1U) != 0) {
      global();
      DVar1 = MainModule::_sysfs_channel_configuration(in_stack_000002a8,in_stack_000002a0);
      in_stack_ffffffffffffff54 = DVar1;
      in_stack_ffffffffffffff48 = global();
      in_stack_ffffffffffffff44 =
           MainModule::_app_channel_configuration
                     (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      if ((in_stack_ffffffffffffff44 == UNKNOWN) && (DVar1 != UNKNOWN)) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "[WARNING] This channel is already in use, continuing anyway. Use setwarnings(false) to disable warnings. "
                                );
        in_stack_ffffffffffffff30 = std::operator<<(poVar3,"channel: ");
        frequency_hz_00 = (int)((ulong)poVar3 >> 0x20);
        poVar3 = std::operator<<(in_stack_ffffffffffffff30,(string *)in_RSI);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        start = (undefined1)((ulong)poVar3 >> 0x38);
      }
    }
    global();
    MainModule::_export_pwm(in_stack_00000280,in_stack_00000278);
    global();
    MainModule::_set_pwm_duty_cycle
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    *(int *)(in_RDI + 0xc4) = -in_EDX;
    _reconfigure((Impl *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 frequency_hz_00,(double)in_stack_ffffffffffffff30,(bool)start);
    global();
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (key_type *)in_stack_ffffffffffffff48);
    *pmVar4 = HARD_PWM;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t create duplicate PWM objects");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Impl(const std::string& channel, int frequency_hz) : _ch_info(global()._channel_to_info(channel, false, true))
        {
            try
            {
                Directions app_cfg = global()._app_channel_configuration(_ch_info);
                if (app_cfg == HARD_PWM)
                    throw std::runtime_error("Can't create duplicate PWM objects");
                /*
                Apps typically set up channels as GPIO before making them be PWM,
                because RPi.GPIO does soft-PWM. We must undo the GPIO export to
                allow HW PWM to run on the pin.
                */
                if (app_cfg == IN || app_cfg == OUT)
                    cleanup(channel);

                if (global()._gpio_warnings)
                {
                    auto sysfs_cfg = global()._sysfs_channel_configuration(_ch_info);
                    app_cfg = global()._app_channel_configuration(_ch_info);

                    // warn if channel has been setup external to current program
                    if (app_cfg == UNKNOWN && sysfs_cfg != UNKNOWN)
                    {
                        std::cerr << "[WARNING] This channel is already in use, continuing "
                                     "anyway. "
                                     "Use setwarnings(false) to disable warnings. "
                                  << "channel: " << channel << std::endl;
                    }
                }

                global()._export_pwm(_ch_info);
                global()._set_pwm_duty_cycle(_ch_info, 0);
                // Anything that doesn't match new frequency_hz
                _frequency_hz = -1 * frequency_hz;
                _reconfigure(frequency_hz, 0.0);
                global()._channel_configuration[channel] = HARD_PWM;
            }
            catch (std::exception& e)
            {
                throw _error(e, "PWM::PWM()");
            }
        }